

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::IsWorthSpecializingToInt32DueToDst(GlobOpt *this,Opnd *dst)

{
  Sym *sym;
  Loop *pLVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d3b,"(dst)","dst");
    if (!bVar3) goto LAB_0045c7cf;
    *puVar6 = 0;
  }
  OVar4 = IR::Opnd::GetKind(dst);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_0045c7cf:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  sym = (Sym *)dst[1]._vptr_Opnd;
  bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,sym);
  bVar5 = true;
  if (!bVar3) {
    pLVar1 = this->currentBlock->loop;
    if (pLVar1 != (Loop *)0x0) {
      bVar3 = GlobOptBlockData::IsLive(&pLVar1->landingPad->globOptData,sym);
      return bVar3;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32DueToDst(IR::Opnd *const dst)
{
    Assert(dst);

    const auto sym = dst->AsRegOpnd()->m_sym;
    return
        CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
        (this->currentBlock->loop && this->currentBlock->loop->landingPad->globOptData.IsLive(sym));
}